

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O2

PVG_FT_Error PVG_FT_Stroker_New(PVG_FT_Stroker *astroker)

{
  PVG_FT_Stroker pPVar1;
  
  pPVar1 = (PVG_FT_Stroker)calloc(1,0xc0);
  if (pPVar1 != (PVG_FT_Stroker)0x0) {
    pPVar1->borders[0].start = -1;
    pPVar1->borders[1].start = -1;
  }
  *astroker = pPVar1;
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_New(PVG_FT_Stroker* astroker)
{
    PVG_FT_Error   error = 0; /* assigned in PVG_FT_NEW */
    PVG_FT_Stroker stroker = NULL;

    stroker = (PVG_FT_StrokerRec*)calloc(1, sizeof(PVG_FT_StrokerRec));
    if (stroker) {
        ft_stroke_border_init(&stroker->borders[0]);
        ft_stroke_border_init(&stroker->borders[1]);
    }

    *astroker = stroker;

    return error;
}